

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
merlin::graphical_model::pseudo_tree
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          graphical_model *this,variable_order_t *order)

{
  ulong uVar1;
  unsigned_long uVar2;
  const_iterator ci;
  bool bVar3;
  size_t sVar4;
  reference puVar5;
  reference pvVar6;
  reference pvVar7;
  variable vVar8;
  variable local_190;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_180;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_178;
  const_iterator k;
  variable local_160;
  variable local_150;
  variable_set local_140;
  variable local_108;
  const_iterator local_f8;
  undefined1 local_d8 [8];
  const_iterator j;
  undefined1 local_a8 [8];
  variable_set vi;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_68;
  const_iterator i;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> adj;
  allocator<unsigned_long> local_31;
  value_type_conflict local_30;
  byte local_21;
  variable_order_t *local_20;
  variable_order_t *order_local;
  graphical_model *this_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *parents;
  
  local_21 = 0;
  local_20 = order;
  order_local = (variable_order_t *)this;
  this_local = (graphical_model *)__return_storage_ptr__;
  sVar4 = nvar(this);
  local_30 = 0xffffffffffffffff;
  std::allocator<unsigned_long>::allocator(&local_31);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,sVar4,&local_30,&local_31);
  std::allocator<unsigned_long>::~allocator(&local_31);
  mrf((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)&i,this);
  local_68._M_current =
       (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(local_20);
  do {
    vi.m_d = (vsize *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(local_20);
    bVar3 = __gnu_cxx::operator!=
                      (&local_68,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)&vi.m_d);
    if (!bVar3) {
      local_21 = 1;
      std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector
                ((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)&i);
      if ((local_21 & 1) == 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator*(&local_68);
    puVar5 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_68);
    uVar1 = *puVar5;
    sVar4 = nvar(this);
    if (uVar1 < sVar4) {
      puVar5 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_68);
      vVar8 = var(this,*puVar5);
      j.m_tmp.m_states = vVar8.m_label;
      sVar4 = _vindex(this,(variable *)&j.m_tmp.m_states);
      pvVar6 = std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::operator[]
                         ((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)&i,
                          sVar4);
      variable_set::variable_set((variable_set *)local_a8,pvVar6);
      variable_set::begin((const_iterator *)local_d8,(variable_set *)local_a8);
      while( true ) {
        variable_set::end(&local_f8,(variable_set *)local_a8);
        ci.m_vs = local_f8.m_vs;
        ci.m_i = local_f8.m_i;
        ci.m_tmp.m_label = local_f8.m_tmp.m_label;
        ci.m_tmp.m_states = local_f8.m_tmp.m_states;
        bVar3 = variable_set::const_iterator::operator!=((const_iterator *)local_d8,ci);
        if (!bVar3) break;
        vVar8 = variable_set::const_iterator::operator*((const_iterator *)local_d8);
        local_108 = vVar8;
        sVar4 = _vindex(this,&local_108);
        pvVar6 = std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::
                 operator[]((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)
                            &i,sVar4);
        variable_set::operator|=(pvVar6,(variable_set *)local_a8);
        puVar5 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_68);
        vVar8 = var(this,*puVar5);
        local_150 = vVar8;
        vVar8 = variable_set::const_iterator::operator*((const_iterator *)local_d8);
        local_160 = vVar8;
        variable_set::variable_set(&local_140,&local_150,&local_160);
        vVar8 = variable_set::const_iterator::operator*((const_iterator *)local_d8);
        k._M_current = (unsigned_long *)vVar8.m_label;
        sVar4 = _vindex(this,(variable *)&k);
        pvVar6 = std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::
                 operator[]((vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> *)
                            &i,sVar4);
        variable_set::operator-=(pvVar6,&local_140);
        variable_set::~variable_set(&local_140);
        variable_set::const_iterator::operator++((const_iterator *)local_d8);
      }
      local_178._M_current = local_68._M_current;
      while( true ) {
        local_180._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(local_20);
        bVar3 = __gnu_cxx::operator!=(&local_178,&local_180);
        if (!bVar3) break;
        puVar5 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_178);
        vVar8 = var(this,*puVar5);
        local_190 = vVar8;
        bVar3 = variable_set::contains((variable_set *)local_a8,&local_190);
        if (bVar3) {
          puVar5 = __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&local_178);
          uVar2 = *puVar5;
          puVar5 = __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&local_68);
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (__return_storage_ptr__,*puVar5);
          *pvVar7 = uVar2;
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_178);
      }
      variable_set::~variable_set((variable_set *)local_a8);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_68);
  } while( true );
}

Assistant:

std::vector<vindex> pseudo_tree(const variable_order_t& order) const {
		std::vector<vindex> parents(nvar(), -1);
		std::vector<variable_set> adj = mrf();

		// Eliminate in the given order of labels, tracking adjacency
		for (variable_order_t::const_iterator i = order.begin(); i != order.end(); ++i) {
			if (*i < 0 || *i >= nvar())
				continue;
			variable_set vi = adj[_vindex(var(*i))];
			for (variable_set::const_iterator j = vi.begin(); j != vi.end(); ++j) {
				adj[_vindex(*j)] |= vi;
				adj[_vindex(*j)] -= variable_set(var(*i), *j);
			}

			for (variable_order_t::const_iterator k = i; k != order.end(); ++k) {
				if (vi.contains(var(*k))) {
					parents[*i] = *k;
					break;
				}
			}
		}
		return parents;
	}